

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscriber_link.cpp
# Opt level: O0

void __thiscall miniros::SubscriberLink::~SubscriberLink(SubscriberLink *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__SubscriberLink_0061fa88;
  std::__cxx11::string::~string((string *)(in_RDI + 0xd));
  std::__cxx11::string::~string((string *)(in_RDI + 6));
  std::weak_ptr<miniros::Publication>::~weak_ptr((weak_ptr<miniros::Publication> *)0x4ced76);
  std::enable_shared_from_this<miniros::SubscriberLink>::~enable_shared_from_this
            ((enable_shared_from_this<miniros::SubscriberLink> *)0x4ced84);
  return;
}

Assistant:

SubscriberLink::~SubscriberLink()
{

}